

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_outlines_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::testOutlines(FuzzHelper *this)

{
  QPDFOutlineObjectHelper *pQVar1;
  QPDFOutlineObjectHelper *ol;
  QPDFOutlineObjectHelper *this_00;
  list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  queue;
  shared_ptr<QPDF> q;
  QPDFOutlineDocumentHelper odh;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_a0;
  _List_base<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  local_88;
  undefined1 local_70 [64];
  
  getQpdf((FuzzHelper *)local_70);
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_prev =
       local_88._M_impl._M_node.super__List_node_base._M_next;
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)(local_70 + 0x20),(QPDF *)local_70._0_8_);
  QPDFOutlineDocumentHelper::getTopLevelOutlines
            (&local_a0,(QPDFOutlineDocumentHelper *)(local_70 + 0x20));
  std::__cxx11::
  list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  ::push_back((list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
               *)&local_88,&local_a0);
  std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector(&local_a0)
  ;
  while (local_88._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_88) {
    pQVar1 = (QPDFOutlineObjectHelper *)
             local_88._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
    for (this_00 = (QPDFOutlineObjectHelper *)
                   local_88._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
        this_00 != pQVar1; this_00 = this_00 + 1) {
      QPDFOutlineObjectHelper::getDestPage((QPDFOutlineObjectHelper *)(local_70 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
      QPDFOutlineObjectHelper::getKids(&local_a0,this_00);
      std::__cxx11::
      list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
      ::push_back((list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
                   *)&local_88,&local_a0);
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                (&local_a0);
    }
    std::__cxx11::
    list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
    ::pop_front((list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
                 *)&local_88);
  }
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)(local_70 + 0x20));
  std::__cxx11::
  _List_base<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  ::_M_clear(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  return;
}

Assistant:

void
FuzzHelper::testOutlines()
{
    std::shared_ptr<QPDF> q = getQpdf();
    std::list<std::vector<QPDFOutlineObjectHelper>> queue;
    QPDFOutlineDocumentHelper odh(*q);
    queue.push_back(odh.getTopLevelOutlines());
    while (!queue.empty()) {
        for (auto& ol: *(queue.begin())) {
            ol.getDestPage();
            queue.push_back(ol.getKids());
        }
        queue.pop_front();
    }
}